

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleCustom.cpp
# Opt level: O0

string * __thiscall
MyCustomTypeHandler::toString_abi_cxx11_
          (MyCustomTypeHandler *this,Slice *value,Options *param_3,Slice *param_4)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  allocator<char> *__a;
  undefined8 *puVar3;
  string *in_RDI;
  undefined8 in_R8;
  int __val;
  uint8_t length;
  char *start;
  allocator<char> *__n;
  string *this_00;
  allocator<char> local_32;
  byte local_31;
  char *local_30;
  
  __val = (int)((ulong)in_R8 >> 0x20);
  this_00 = in_RDI;
  uVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x104254);
  if (uVar1 == 0xf0) {
    std::__cxx11::to_string(__val);
  }
  else {
    uVar1 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x10427c);
    if (uVar1 != 0xf4) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "unknown type!";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    local_30 = arangodb::velocypack::
               SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
               startAs<char_const>((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                    *)0x104294);
    puVar2 = arangodb::velocypack::
             SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        0x1042a3);
    local_31 = puVar2[1];
    __a = (allocator<char> *)(ulong)local_31;
    __n = &local_32;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,(char *)in_RDI,(size_type)__n,__a);
    std::allocator<char>::~allocator(&local_32);
  }
  return this_00;
}

Assistant:

std::string toString(Slice const& value, Options const*, Slice const&) final {
    if (value.head() == 0xf0) {
      return std::to_string(myMagicNumber);
    }
    if (value.head() == 0xf4) {
      char const* start = value.startAs<char const>();
      // read string length
      uint8_t length = *(value.start() + 1);
      // append string (don't care about escaping here...)
      return std::string(start, length);
    }
    throw "unknown type!";
  }